

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cc
# Opt level: O0

void Minisat::limitMemory(uint64_t max_mem_mb)

{
  int iVar1;
  long in_RDI;
  rlimit rl;
  rlim_t new_mem_lim;
  rlimit local_20;
  ulong local_10;
  
  if (in_RDI != 0) {
    local_10 = in_RDI << 0x14;
    getrlimit(RLIMIT_AS,&local_20);
    if ((local_20.rlim_max == 0xffffffffffffffff) || (local_10 < local_20.rlim_max)) {
      local_20.rlim_cur = local_10;
      iVar1 = setrlimit(RLIMIT_AS,&local_20);
      if (iVar1 == -1) {
        printf("WARNING! Could not set resource limit: Virtual memory.\n");
      }
    }
  }
  return;
}

Assistant:

void Minisat::limitMemory(uint64_t max_mem_mb)
{
// FIXME: OpenBSD does not support RLIMIT_AS. Not sure how well RLIMIT_DATA works instead.
#if defined(__OpenBSD__)
#define RLIMIT_AS RLIMIT_DATA
#endif

    // Set limit on virtual memory:
    if (max_mem_mb != 0){
        rlim_t new_mem_lim = (rlim_t)max_mem_mb * 1024*1024;
        rlimit rl;
        getrlimit(RLIMIT_AS, &rl);
        if (rl.rlim_max == RLIM_INFINITY || new_mem_lim < rl.rlim_max){
            rl.rlim_cur = new_mem_lim;
            if (setrlimit(RLIMIT_AS, &rl) == -1)
                printf("WARNING! Could not set resource limit: Virtual memory.\n");
        }
    }

#if defined(__OpenBSD__)
#undef RLIMIT_AS
#endif
}